

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clparser_test.cc
# Opt level: O0

Test * CLParserTestParseFilenameFilter::Create(void)

{
  Test *this;
  
  this = (Test *)operator_new(0x10);
  CLParserTestParseFilenameFilter((CLParserTestParseFilenameFilter *)this);
  g_current_test = this;
  return this;
}

Assistant:

TEST(CLParserTest, ParseFilenameFilter) {
  CLParser parser;
  string output, err;
  ASSERT_TRUE(parser.Parse(
      "foo.cc\r\n"
      "cl: warning\r\n",
      "", &output, &err));
  ASSERT_EQ("cl: warning\n", output);
}